

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O2

bool OpenSSLWrapper::GetCertInformation
               (X509 *cert,string *strCommonName,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *vstrAltNames)

{
  pointer pcVar1;
  size_type sVar2;
  char *pcVar3;
  _Alloc_hider _Var4;
  int iVar5;
  int iVar6;
  uint uVar7;
  X509_NAME *a;
  long lVar8;
  ulong uVar9;
  void *pvVar10;
  int *piVar11;
  void *__src;
  size_t __n;
  undefined1 *__dest;
  string *this;
  size_type sVar12;
  uchar *utf8;
  int local_144;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_140;
  string *local_138;
  string caAddrClient;
  string servInfoClient;
  string strTmp_1;
  string caBuf;
  string strTmp;
  undefined1 local_38 [8];
  
  caBuf._M_dataplus._M_p = (pointer)&caBuf.field_2;
  local_140 = vstrAltNames;
  std::__cxx11::string::_M_construct((ulong)&caBuf,'\0');
  a = X509_get_subject_name((X509 *)cert);
  X509_NAME_oneline(a,caBuf._M_dataplus._M_p,(int)caBuf._M_string_length);
  std::__cxx11::string::assign((char *)strCommonName);
  lVar8 = std::__cxx11::string::find((char *)strCommonName,0x12e7d8);
  if (lVar8 != -1) {
    std::__cxx11::string::erase((ulong)strCommonName,0);
    uVar9 = std::__cxx11::string::find((char *)strCommonName,0x12e7dd);
    if (uVar9 != 0xffffffffffffffff) {
      std::__cxx11::string::erase((ulong)strCommonName,uVar9);
    }
    pcVar1 = (strCommonName->_M_dataplus)._M_p;
    sVar2 = strCommonName->_M_string_length;
    for (sVar12 = 0; sVar2 != sVar12; sVar12 = sVar12 + 1) {
      iVar5 = tolower((int)pcVar1[sVar12]);
      pcVar1[sVar12] = (char)iVar5;
    }
    pcVar3 = (strCommonName->_M_dataplus)._M_p;
    if ((*pcVar3 == '*') && (pcVar3[1] == '.')) {
      std::__cxx11::string::substr((ulong)&servInfoClient,(ulong)strCommonName);
      std::operator+(&caAddrClient,"^(.+\\.)?",&servInfoClient);
      std::operator+(&strTmp,&caAddrClient,"$");
      std::__cxx11::string::operator=((string *)strCommonName,(string *)&strTmp);
      std::__cxx11::string::~string((string *)&strTmp);
      std::__cxx11::string::~string((string *)&caAddrClient);
      std::__cxx11::string::~string((string *)&servInfoClient);
    }
  }
  pvVar10 = X509_get_ext_d2i((X509 *)cert,0x55,(int *)0x0,(int *)0x0);
  if (pvVar10 != (void *)0x0) {
    local_144 = OPENSSL_sk_num(pvVar10);
    iVar5 = 0;
    if (local_144 < 1) {
      local_144 = 0;
    }
    local_138 = strCommonName;
    while( true ) {
      if (iVar5 == local_144) break;
      piVar11 = (int *)OPENSSL_sk_value(pvVar10);
      if (piVar11 != (int *)0x0) {
        if (*piVar11 == 7) {
          __src = (void *)ASN1_STRING_get0_data(*(undefined8 *)(piVar11 + 2));
          uVar7 = ASN1_STRING_length(*(ASN1_STRING **)(piVar11 + 2));
          if (__src == (void *)0x0) goto LAB_0011d95e;
          strTmp._M_dataplus._M_p._0_2_ = (ushort)(4 < (int)uVar7) * 8 + 2;
          if ((int)uVar7 < 5) {
            if (uVar7 != 0) {
              __n = (size_t)(int)uVar7;
              __dest = (undefined1 *)((long)&strTmp._M_dataplus._M_p + 4);
              goto LAB_0011d87d;
            }
          }
          else {
            __n = (size_t)uVar7;
            __dest = local_38;
LAB_0011d87d:
            memmove(__dest,__src,__n);
          }
          caAddrClient._M_dataplus._M_p = (pointer)&caAddrClient.field_2;
          std::__cxx11::string::_M_construct((ulong)&caAddrClient,'/');
          servInfoClient._M_dataplus._M_p = (pointer)&servInfoClient.field_2;
          std::__cxx11::string::_M_construct((ulong)&servInfoClient,' ');
          iVar6 = getnameinfo((sockaddr *)&strTmp,0x80,caAddrClient._M_dataplus._M_p,0x20,
                              servInfoClient._M_dataplus._M_p,0x20,3);
          if (iVar6 == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&strTmp_1,caAddrClient._M_dataplus._M_p,(allocator<char> *)&utf8);
            sVar2 = strTmp_1._M_string_length;
            _Var4 = strTmp_1._M_dataplus;
            for (sVar12 = 0; sVar2 != sVar12; sVar12 = sVar12 + 1) {
              iVar6 = tolower((int)_Var4._M_p[sVar12]);
              _Var4._M_p[sVar12] = (char)iVar6;
            }
            iVar6 = std::__cxx11::string::compare((string *)local_138);
            if (iVar6 != 0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(local_140,&strTmp_1);
            }
            std::__cxx11::string::~string((string *)&strTmp_1);
          }
          this = &caAddrClient;
          std::__cxx11::string::~string((string *)&servInfoClient);
        }
        else {
          if (*piVar11 != 2) goto LAB_0011d95e;
          utf8 = (uchar *)0x0;
          ASN1_STRING_to_UTF8(&utf8,*(ASN1_STRING **)(piVar11 + 2));
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&strTmp,(char *)utf8,(allocator<char> *)&caAddrClient);
          sVar2 = strTmp._M_string_length;
          lVar8 = CONCAT62(strTmp._M_dataplus._M_p._2_6_,(short)strTmp._M_dataplus._M_p);
          for (sVar12 = 0; sVar2 != sVar12; sVar12 = sVar12 + 1) {
            iVar6 = tolower((int)*(char *)(lVar8 + sVar12));
            *(char *)(lVar8 + sVar12) = (char)iVar6;
          }
          iVar6 = std::__cxx11::string::compare((string *)local_138);
          if (iVar6 != 0) {
            if ((*(char *)CONCAT62(strTmp._M_dataplus._M_p._2_6_,(short)strTmp._M_dataplus._M_p) ==
                 '*') && (((char *)CONCAT62(strTmp._M_dataplus._M_p._2_6_,
                                            (short)strTmp._M_dataplus._M_p))[1] == '.')) {
              std::__cxx11::string::substr((ulong)&strTmp_1,(ulong)&strTmp);
              std::operator+(&servInfoClient,"^(.+\\.)?",&strTmp_1);
              std::operator+(&caAddrClient,&servInfoClient,"$");
              std::__cxx11::string::operator=((string *)&strTmp,(string *)&caAddrClient);
              std::__cxx11::string::~string((string *)&caAddrClient);
              std::__cxx11::string::~string((string *)&servInfoClient);
              std::__cxx11::string::~string((string *)&strTmp_1);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_140,&strTmp);
          }
          if (utf8 != (uchar *)0x0) {
            CRYPTO_free(utf8);
          }
          this = &strTmp;
        }
        std::__cxx11::string::~string((string *)this);
      }
LAB_0011d95e:
      iVar5 = iVar5 + 1;
    }
    OPENSSL_sk_pop_free(pvVar10,GENERAL_NAME_free);
  }
  std::__cxx11::string::~string((string *)&caBuf);
  return true;
}

Assistant:

bool GetCertInformation(const X509* cert, string& strCommonName, vector<string>& vstrAltNames)
    {
        string caBuf(256, 0);
        X509_NAME_oneline(X509_get_subject_name(cert), &caBuf[0], static_cast<int>(caBuf.size()));

        strCommonName = &caBuf[0];
        size_t nPos = strCommonName.find("/CN=");
        if (nPos != string::npos)
        {
            strCommonName.erase(0, nPos + 4);
            nPos = strCommonName.find("/");
            if (nPos != string::npos)
                strCommonName.erase(nPos, string::npos);
            transform(begin(strCommonName), end(strCommonName), begin(strCommonName), [](char c) noexcept { return static_cast<char>(::tolower(c)); });

            if (strCommonName[0] == '*' && strCommonName[1] == '.')
                strCommonName = "^(.+\\.)?" + strCommonName.substr(2) + "$";
        }

        STACK_OF(GENERAL_NAME)* pSubAltNames = static_cast<STACK_OF(GENERAL_NAME)*>(X509_get_ext_d2i(cert, NID_subject_alt_name, nullptr, nullptr));
        if (pSubAltNames != nullptr)
        {
            const int iCountNames = sk_GENERAL_NAME_num(pSubAltNames);
            for (int i = 0; i < iCountNames; ++i)
            {
                const GENERAL_NAME* entry = sk_GENERAL_NAME_value(pSubAltNames, i);
                if (!entry) continue;

                if (entry->type == GEN_DNS)
                {
                    unsigned char* utf8 = nullptr;
                    ASN1_STRING_to_UTF8(&utf8, entry->d.dNSName);

                    string strTmp(reinterpret_cast<char*>(utf8));
                    transform(begin(strTmp), end(strTmp), begin(strTmp), [](char c) noexcept { return static_cast<char>(::tolower(c)); });
                    if (strCommonName.compare(strTmp) != 0)
                    {
                        if (strTmp[0] == '*' && strTmp[1] == '.')
                            strTmp = "^(.+\\.)?" + strTmp.substr(2) + "$";
                        vstrAltNames.push_back(strTmp);
                    }
                    if (utf8)
                        OPENSSL_free(utf8);
                }
                else if (entry->type == GEN_IPADD)
                {
                    const uint8_t* szIp = ASN1_STRING_get0_data(entry->d.iPAddress);
                    const int iStrLen = ASN1_STRING_length(entry->d.iPAddress);
                    if (szIp != nullptr)
                    {
                        struct sockaddr_storage addr;
                        addr.ss_family = iStrLen > 4 ? AF_INET6 : AF_INET;
                        if (iStrLen > 4)
                            copy(&szIp[0], &szIp[iStrLen], reinterpret_cast<uint8_t*>(&addr.__ss_align));
                        else
                            copy(&szIp[0], &szIp[iStrLen], reinterpret_cast<uint8_t*>(&addr.ss_family) + 4);
                        string caAddrClient(INET6_ADDRSTRLEN + 1, 0);
                        string servInfoClient(NI_MAXSERV, 0);
                        if (::getnameinfo(reinterpret_cast<struct sockaddr*>(&addr), sizeof(struct sockaddr_storage), &caAddrClient[0], sizeof(caAddrClient), &servInfoClient[0], NI_MAXSERV, NI_NUMERICHOST | NI_NUMERICSERV) == 0)
                        {
                            string strTmp(&caAddrClient[0]);
                            transform(begin(strTmp), end(strTmp), begin(strTmp), [](char c) noexcept { return static_cast<char>(::tolower(c)); });
                            if (strCommonName.compare(strTmp) != 0)
                                vstrAltNames.push_back(strTmp);
                        }
                    }
                }
            }

            sk_GENERAL_NAME_pop_free(pSubAltNames, GENERAL_NAME_free);
        }

        return true;
    }